

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes64>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes64> *this,DynamicEntryList *entries)

{
  long lVar1;
  unsigned_long uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 uVar7;
  pointer ppVar8;
  ELF_Dyn dyn;
  undefined8 local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  ppVar8 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar8 != (entries->
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar1 = ppVar8->first;
      uVar2 = ppVar8->second;
      local_40 = lVar1;
      local_38 = uVar2;
      if ((this->super_cmELFInternal).NeedSwap == true) {
        local_40._0_1_ = (undefined1)lVar1;
        uVar7 = (undefined1)local_40;
        local_40._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
        local_40._1_2_ = (ushort)((ulong)lVar1 >> 8);
        uVar3 = local_40._1_2_ << 8;
        uVar5 = local_40._1_2_ >> 8;
        local_40._5_2_ = (ushort)((ulong)lVar1 >> 0x28);
        local_40._3_2_ = (ushort)((ulong)lVar1 >> 0x18);
        uVar4 = local_40._3_2_ << 8;
        uVar6 = local_40._3_2_ >> 8;
        local_40 = CONCAT35(CONCAT12(uVar7,uVar3 | uVar5),
                            CONCAT23(uVar4 | uVar6,
                                     CONCAT21(local_40._5_2_ << 8 | local_40._5_2_ >> 8,
                                              local_40._7_1_)));
        local_38._0_2_ = (ushort)uVar2;
        uVar3 = (ushort)local_38 << 8;
        uVar5 = (ushort)local_38 >> 8;
        local_38._6_2_ = (ushort)(uVar2 >> 0x30);
        local_38._2_1_ = (undefined1)(uVar2 >> 0x10);
        uVar7 = local_38._2_1_;
        local_38._5_1_ = (undefined1)(uVar2 >> 0x28);
        local_38._3_2_ = (ushort)(uVar2 >> 0x18);
        uVar4 = local_38._3_2_ << 8;
        uVar6 = local_38._3_2_ >> 8;
        local_38 = CONCAT35(CONCAT21(uVar3 | uVar5,uVar7),
                            CONCAT23(uVar4 | uVar6,
                                     CONCAT12(local_38._5_1_,
                                              local_38._6_2_ << 8 | local_38._6_2_ >> 8)));
      }
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_40,&stack0xffffffffffffffd0);
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != (entries->
                       super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (cmELF::DynamicEntryList::const_iterator it = entries.begin();
       it != entries.end(); it++) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(it->first);
    dyn.d_un.d_val = static_cast<tagtype>(it->second);

    if (this->NeedSwap) {
      ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    result.insert(result.end(), pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}